

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeEnter(Vdbe *p)

{
  Btree *p_00;
  long lVar1;
  long lVar2;
  Btree **ppBVar3;
  
  if (p->lockMask != 0) {
    lVar2 = (long)p->db->nDb;
    if (0 < lVar2) {
      ppBVar3 = &p->db->aDb->pBt;
      lVar1 = 0;
      do {
        if ((((lVar1 != 1) && ((p->lockMask >> ((uint)lVar1 & 0x1f) & 1) != 0)) &&
            (p_00 = *ppBVar3, p_00 != (Btree *)0x0)) &&
           ((p_00->sharable != '\0' &&
            (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')))) {
          btreeLockCarefully(p_00);
        }
        lVar1 = lVar1 + 1;
        ppBVar3 = ppBVar3 + 4;
      } while (lVar2 != lVar1);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeEnter(Vdbe *p){
  int i;
  sqlite3 *db;
  Db *aDb;
  int nDb;
  if( DbMaskAllZero(p->lockMask) ) return;  /* The common case */
  db = p->db;
  aDb = db->aDb;
  nDb = db->nDb;
  for(i=0; i<nDb; i++){
    if( i!=1 && DbMaskTest(p->lockMask,i) && ALWAYS(aDb[i].pBt!=0) ){
      sqlite3BtreeEnter(aDb[i].pBt);
    }
  }
}